

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *includes,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  bool bVar1;
  pointer ppTVar2;
  cmLinkImplItem *this;
  cmGeneratorTarget *this_00;
  cmLocalGenerator *pcVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  pointer ppTVar9;
  undefined4 extraout_var;
  ostream *poVar10;
  string *psVar11;
  cmake *this_01;
  PolicyID id;
  PolicyID id_00;
  pointer filename;
  MessageType MVar12;
  __ireturn_type _Var13;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  TargetPropertyEntry *local_278;
  string *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string usedIncludes;
  cmListFileBacktrace local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string inc;
  
  ppTVar9 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar9 == ppTVar2) {
      return;
    }
    local_278 = *ppTVar9;
    this = local_278->LinkImplItem;
    local_270 = cmLinkItem::AsStr_abi_cxx11_(&this->super_cmLinkItem);
    this_00 = (this->super_cmLinkItem).Target;
    if (this_00 == (cmGeneratorTarget *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = cmGeneratorTarget::IsImported(this_00);
    }
    bVar1 = this->FromGenex;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar7 = (*local_278->_vptr_TargetPropertyEntry[3])
                      (local_278,tgt->LocalGenerator,config,0,tgt,dagChecker,language);
    cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar7),&entryIncludes,false);
    pbVar4 = entryIncludes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    usedIncludes._M_dataplus._M_p = (pointer)&usedIncludes.field_2;
    usedIncludes._M_string_length = 0;
    usedIncludes.field_2._M_local_buf[0] = '\0';
    filename = entryIncludes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (filename == pbVar4) break;
      if ((bVar5 != false) && (bVar6 = cmsys::SystemTools::FileExists(filename), !bVar6)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        MVar12 = FATAL_ERROR;
        if (bVar1 != false) {
          PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
          if (PVar8 != OLD) {
            if (PVar8 != WARN) goto LAB_002b61ab;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_298,(cmPolicies *)0x1b,id_00);
            poVar10 = std::operator<<((ostream *)&inc,(string *)&local_298);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)&local_298);
          }
          MVar12 = AUTHOR_WARNING;
        }
LAB_002b61ab:
        poVar10 = std::operator<<((ostream *)&inc,"Imported target \"");
        poVar10 = std::operator<<(poVar10,(string *)local_270);
        poVar10 = std::operator<<(poVar10,"\" includes non-existent path\n  \"");
        poVar10 = std::operator<<(poVar10,(string *)filename);
        std::operator<<(poVar10,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar3 = tgt->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(pcVar3,MVar12,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        goto LAB_002b6229;
      }
      bVar6 = cmsys::SystemTools::FileIsFullPath(filename);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        if (local_270->_M_string_length == 0) {
          PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar8 == OLD) {
            bVar6 = true;
            MVar12 = FATAL_ERROR;
          }
          else if (PVar8 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_298,(cmPolicies *)0x15,id);
            poVar10 = std::operator<<((ostream *)&inc,(string *)&local_298);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)&local_298);
            MVar12 = AUTHOR_WARNING;
            bVar6 = false;
          }
          else {
            bVar6 = false;
            MVar12 = FATAL_ERROR;
          }
          poVar10 = std::operator<<((ostream *)&inc,
                                    "Found relative path while evaluating include directories of \""
                                   );
          psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar10 = std::operator<<(poVar10,(string *)psVar11);
          poVar10 = std::operator<<(poVar10,"\":\n  \"");
          poVar10 = std::operator<<(poVar10,(string *)filename);
          std::operator<<(poVar10,"\"\n");
          if (!bVar6) goto LAB_002b5f17;
        }
        else {
          poVar10 = std::operator<<((ostream *)&inc,"Target \"");
          poVar10 = std::operator<<(poVar10,(string *)local_270);
          poVar10 = std::operator<<(poVar10,
                                    "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                   );
          poVar10 = std::operator<<(poVar10,(string *)filename);
          std::operator<<(poVar10,"\"");
          MVar12 = FATAL_ERROR;
LAB_002b5f17:
          pcVar3 = tgt->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar3,MVar12,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          if (MVar12 == FATAL_ERROR) {
LAB_002b6229:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
            std::__cxx11::string::~string((string *)&usedIncludes);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entryIncludes);
            return;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
      }
      bVar6 = cmSystemTools::IsOff(filename);
      if (!bVar6) {
        cmsys::SystemTools::ConvertToUnixSlashes(filename);
      }
      std::__cxx11::string::string((string *)&inc,(string *)filename);
      _Var13 = std::__detail::
               _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)uniqueIncludes,&inc);
      if (((undefined1  [16])_Var13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*local_278->_vptr_TargetPropertyEntry[4])(&local_298);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   includes,&inc,(cmListFileBacktrace *)&local_298);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        if (debugIncludes) {
          std::operator+(&local_1e8," * ",&inc);
          std::operator+(&local_298,&local_1e8,"\n");
          std::__cxx11::string::append((string *)&usedIncludes);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
      }
      std::__cxx11::string::~string((string *)&inc);
      filename = filename + 1;
    }
    if (usedIncludes._M_string_length != 0) {
      this_01 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Used includes for target ",&local_299);
      psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_1e8,&local_1c8,psVar11);
      std::operator+(&local_298,&local_1e8,":\n");
      std::operator+(&inc,&local_298,&usedIncludes);
      (*local_278->_vptr_TargetPropertyEntry[4])(&local_1f8);
      cmake::IssueMessage(this_01,LOG,&inc,&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1f8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&inc);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::string::~string((string *)&usedIncludes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryIncludes);
    ppTVar9 = ppTVar9 + 1;
  } while( true );
}

Assistant:

static void processIncludeDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& includes,
  std::unordered_set<std::string>& uniqueIncludes,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugIncludes, const std::string& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryIncludes);

    std::string usedIncludes;
    for (std::string& entryInclude : entryIncludes) {
      if (fromImported && !cmSystemTools::FileExists(entryInclude)) {
        std::ostringstream e;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (checkCMP0027) {
          switch (tgt->GetPolicyStatusCMP0027()) {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
              CM_FALLTHROUGH;
            case cmPolicies::OLD:
              messageType = MessageType::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
        /* clang-format off */
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << entryInclude << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        /* clang-format on */
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
      }

      if (!cmSystemTools::FileIsFullPath(entryInclude)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << entryInclude << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0021()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating include directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryInclude << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      if (!cmSystemTools::IsOff(entryInclude)) {
        cmSystemTools::ConvertToUnixSlashes(entryInclude);
      }
      std::string inc = entryInclude;

      if (uniqueIncludes.insert(inc).second) {
        includes.emplace_back(inc, entry->GetBacktrace());
        if (debugIncludes) {
          usedIncludes += " * " + inc + "\n";
        }
      }
    }
    if (!usedIncludes.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used includes for target ") + tgt->GetName() + ":\n" +
          usedIncludes,
        entry->GetBacktrace());
    }
  }
}